

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::SwapPositionsInAEL(Clipper *this,TEdge *edge1,TEdge *edge2)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *prev_2;
  TEdge *next_2;
  TEdge *prev_1;
  TEdge *next_1;
  TEdge *prev;
  TEdge *next;
  TEdge *edge2_local;
  TEdge *edge1_local;
  Clipper *this_local;
  
  if (((edge1->nextInAEL != (TEdge *)0x0) || (edge1->prevInAEL != (TEdge *)0x0)) &&
     ((edge2->nextInAEL != (TEdge *)0x0 || (edge2->prevInAEL != (TEdge *)0x0)))) {
    if (edge1->nextInAEL == edge2) {
      pTVar1 = edge2->nextInAEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->prevInAEL = edge1;
      }
      pTVar2 = edge1->prevInAEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->nextInAEL = edge2;
      }
      edge2->prevInAEL = pTVar2;
      edge2->nextInAEL = edge1;
      edge1->prevInAEL = edge2;
      edge1->nextInAEL = pTVar1;
    }
    else if (edge2->nextInAEL == edge1) {
      pTVar1 = edge1->nextInAEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->prevInAEL = edge2;
      }
      pTVar2 = edge2->prevInAEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->nextInAEL = edge1;
      }
      edge1->prevInAEL = pTVar2;
      edge1->nextInAEL = edge2;
      edge2->prevInAEL = edge1;
      edge2->nextInAEL = pTVar1;
    }
    else {
      pTVar1 = edge1->nextInAEL;
      pTVar2 = edge1->prevInAEL;
      edge1->nextInAEL = edge2->nextInAEL;
      if (edge1->nextInAEL != (TEdge *)0x0) {
        edge1->nextInAEL->prevInAEL = edge1;
      }
      edge1->prevInAEL = edge2->prevInAEL;
      if (edge1->prevInAEL != (TEdge *)0x0) {
        edge1->prevInAEL->nextInAEL = edge1;
      }
      edge2->nextInAEL = pTVar1;
      if (edge2->nextInAEL != (TEdge *)0x0) {
        edge2->nextInAEL->prevInAEL = edge2;
      }
      edge2->prevInAEL = pTVar2;
      if (edge2->prevInAEL != (TEdge *)0x0) {
        edge2->prevInAEL->nextInAEL = edge2;
      }
    }
    if (edge1->prevInAEL == (TEdge *)0x0) {
      this->m_ActiveEdges = edge1;
    }
    else if (edge2->prevInAEL == (TEdge *)0x0) {
      this->m_ActiveEdges = edge2;
    }
  }
  return;
}

Assistant:

void Clipper::SwapPositionsInAEL(TEdge *edge1, TEdge *edge2)
{
  if(  !edge1->nextInAEL &&  !edge1->prevInAEL ) return;
  if(  !edge2->nextInAEL &&  !edge2->prevInAEL ) return;

  if(  edge1->nextInAEL == edge2 )
  {
    TEdge* next = edge2->nextInAEL;
    if( next ) next->prevInAEL = edge1;
    TEdge* prev = edge1->prevInAEL;
    if( prev ) prev->nextInAEL = edge2;
    edge2->prevInAEL = prev;
    edge2->nextInAEL = edge1;
    edge1->prevInAEL = edge2;
    edge1->nextInAEL = next;
  }
  else if(  edge2->nextInAEL == edge1 )
  {
    TEdge* next = edge1->nextInAEL;
    if( next ) next->prevInAEL = edge2;
    TEdge* prev = edge2->prevInAEL;
    if( prev ) prev->nextInAEL = edge1;
    edge1->prevInAEL = prev;
    edge1->nextInAEL = edge2;
    edge2->prevInAEL = edge1;
    edge2->nextInAEL = next;
  }
  else
  {
    TEdge* next = edge1->nextInAEL;
    TEdge* prev = edge1->prevInAEL;
    edge1->nextInAEL = edge2->nextInAEL;
    if( edge1->nextInAEL ) edge1->nextInAEL->prevInAEL = edge1;
    edge1->prevInAEL = edge2->prevInAEL;
    if( edge1->prevInAEL ) edge1->prevInAEL->nextInAEL = edge1;
    edge2->nextInAEL = next;
    if( edge2->nextInAEL ) edge2->nextInAEL->prevInAEL = edge2;
    edge2->prevInAEL = prev;
    if( edge2->prevInAEL ) edge2->prevInAEL->nextInAEL = edge2;
  }

  if( !edge1->prevInAEL ) m_ActiveEdges = edge1;
  else if( !edge2->prevInAEL ) m_ActiveEdges = edge2;
}